

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O0

void __thiscall fasttext::DenseMatrix::addRowToVector(DenseMatrix *this,Vector *x,int32_t i,real a)

{
  undefined1 auVar1 [16];
  DenseMatrix *this_00;
  int64_t iVar2;
  Matrix *this_01;
  Matrix *pMVar3;
  real *prVar4;
  int in_EDX;
  long in_RDI;
  uint in_XMM0_Da;
  int64_t j;
  int64_t in_stack_ffffffffffffffb8;
  real in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint uVar5;
  Matrix *in_stack_ffffffffffffffc8;
  long local_20;
  
  if (in_EDX < 0) {
    __assert_fail("i >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cfasttext/fasttext/src/densematrix.cc"
                  ,0x8d,
                  "virtual void fasttext::DenseMatrix::addRowToVector(Vector &, int32_t, real) const"
                 );
  }
  this_00 = (DenseMatrix *)(long)in_EDX;
  iVar2 = Matrix::size(in_stack_ffffffffffffffc8,
                       CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  if ((long)this_00 < iVar2) {
    this_01 = (Matrix *)Vector::size((Vector *)0x1e0baa);
    pMVar3 = (Matrix *)
             Matrix::size(this_01,CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    if (this_01 == pMVar3) {
      for (local_20 = 0; local_20 < *(long *)(in_RDI + 0x10); local_20 = local_20 + 1) {
        uVar5 = in_XMM0_Da;
        prVar4 = at(this_00,(int64_t)this_01,CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffc0));
        in_stack_ffffffffffffffc0 = *prVar4;
        prVar4 = Vector::operator[]((Vector *)CONCAT44(uVar5,in_stack_ffffffffffffffc0),
                                    in_stack_ffffffffffffffb8);
        auVar1 = vfmadd213ss_fma(ZEXT416((uint)in_stack_ffffffffffffffc0),ZEXT416(uVar5),
                                 ZEXT416((uint)*prVar4));
        *prVar4 = auVar1._0_4_;
      }
      return;
    }
    __assert_fail("x.size() == this->size(1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cfasttext/fasttext/src/densematrix.cc"
                  ,0x8f,
                  "virtual void fasttext::DenseMatrix::addRowToVector(Vector &, int32_t, real) const"
                 );
  }
  __assert_fail("i < this->size(0)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cfasttext/fasttext/src/densematrix.cc"
                ,0x8e,
                "virtual void fasttext::DenseMatrix::addRowToVector(Vector &, int32_t, real) const")
  ;
}

Assistant:

void DenseMatrix::addRowToVector(Vector& x, int32_t i, real a) const {
  assert(i >= 0);
  assert(i < this->size(0));
  assert(x.size() == this->size(1));
  for (int64_t j = 0; j < n_; j++) {
    x[j] += a * at(i, j);
  }
}